

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

void findNotifyBits(int pi)

{
  callback_t *pcVar1;
  callback_t **ppcVar2;
  uint32_t bits;
  
  bits = 0;
  ppcVar2 = &gCallBackFirst;
  while (pcVar1 = *ppcVar2, pcVar1 != (callback_t *)0x0) {
    if (pcVar1->pi == pi) {
      bits = bits | 1 << ((byte)pcVar1->gpio & 0x1f);
    }
    ppcVar2 = &pcVar1->next;
  }
  if (bits == gNotifyBits[pi]) {
    return;
  }
  gNotifyBits[pi] = bits;
  pigpio_command(pi,0x13,gPigHandle[pi],bits,1);
  return;
}

Assistant:

static void findNotifyBits(int pi)
{
   callback_t *p;
   uint32_t bits = 0;

   p = gCallBackFirst;

   while (p)
   {
      if (p->pi == pi) bits |= (1<<(p->gpio));
      p = p->next;
   }

   if (bits != gNotifyBits[pi])
   {
      gNotifyBits[pi] = bits;
      pigpio_command(pi, PI_CMD_NB, gPigHandle[pi], gNotifyBits[pi], 1);
   }
}